

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

stbi_uc * stbi__resample_row_hv_2(stbi_uc *out,stbi_uc *in_near,stbi_uc *in_far,int w,int hs)

{
  byte bVar1;
  stbi_uc sVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  
  bVar1 = *in_near;
  uVar5 = (uint)*in_far;
  if (w == 1) {
    sVar2 = (stbi_uc)((uint)bVar1 + (uint)bVar1 * 2 + uVar5 + 2 >> 2);
    out[1] = sVar2;
    *out = sVar2;
    return out;
  }
  iVar3 = (uint)bVar1 + (uint)bVar1 * 2;
  sVar2 = (stbi_uc)(uVar5 + iVar3 + 2 >> 2);
  *out = sVar2;
  if (1 < w) {
    uVar6 = 1;
    iVar3 = iVar3 + uVar5;
    do {
      iVar4 = (uint)in_far[uVar6] + (uint)in_near[uVar6] + (uint)in_near[uVar6] * 2;
      out[uVar6 * 2 + -1] = (stbi_uc)(iVar3 * 3 + iVar4 + 8U >> 4);
      out[uVar6 * 2] = (stbi_uc)(iVar3 + iVar4 * 3 + 8U >> 4);
      uVar6 = uVar6 + 1;
      iVar3 = iVar4;
    } while ((uint)w != uVar6);
    sVar2 = (stbi_uc)(iVar4 + 2U >> 2);
  }
  out[(long)w * 2 + -1] = sVar2;
  return out;
}

Assistant:

static stbi_uc *stbi__resample_row_hv_2(stbi_uc *out, stbi_uc *in_near, stbi_uc *in_far, int w, int hs)
{
   // need to generate 2x2 samples for every one in input
   int i,t0,t1;
   if (w == 1) {
      out[0] = out[1] = stbi__div4(3*in_near[0] + in_far[0] + 2);
      return out;
   }

   t1 = 3*in_near[0] + in_far[0];
   out[0] = stbi__div4(t1+2);
   for (i=1; i < w; ++i) {
      t0 = t1;
      t1 = 3*in_near[i]+in_far[i];
      out[i*2-1] = stbi__div16(3*t0 + t1 + 8);
      out[i*2  ] = stbi__div16(3*t1 + t0 + 8);
   }
   out[w*2-1] = stbi__div4(t1+2);

   STBI_NOTUSED(hs);

   return out;
}